

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddressWithoutOffset
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Literal *ptr,Index bytes,Address memorySize)

{
  bool bVar1;
  int32_t iVar2;
  uint64_t local_70;
  Address local_48;
  BasicType local_3c;
  uint64_t local_38;
  uint64_t addr;
  Literal *pLStack_28;
  Index bytes_local;
  Literal *ptr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Address memorySize_local;
  
  local_3c = i32;
  addr._4_4_ = bytes;
  pLStack_28 = ptr;
  ptr_local = (Literal *)this;
  this_local = (ModuleRunnerBase<wasm::ModuleRunner> *)memorySize.addr;
  bVar1 = wasm::Type::operator==(&ptr->type,&local_3c);
  if (bVar1) {
    iVar2 = wasm::Literal::geti32(ptr);
    local_70 = (uint64_t)iVar2;
  }
  else {
    local_70 = wasm::Literal::geti64(ptr);
  }
  local_38 = local_70;
  wasm::Address::Address(&local_48,local_70);
  checkLoadAddress(this,local_48,addr._4_4_,(Address)this_local);
  wasm::Address::Address(&memorySize_local,local_38);
  return (Address)memorySize_local.addr;
}

Assistant:

Address
  getFinalAddressWithoutOffset(Literal ptr, Index bytes, Address memorySize) {
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }